

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O0

int str_find_aux(lua_State *L,int find)

{
  char cVar1;
  int iVar2;
  char *s_00;
  lua_Integer pos;
  char *e;
  bool bVar3;
  char *res;
  char *pcStack_280;
  int anchor;
  char *s1;
  MatchState ms;
  char *s2;
  lua_Integer init;
  char *p;
  char *s;
  size_t lp;
  size_t ls;
  lua_State *plStack_18;
  int find_local;
  lua_State *L_local;
  
  ls._4_4_ = find;
  plStack_18 = L;
  s_00 = luaL_checklstring(L,1,&lp);
  init = (lua_Integer)luaL_checklstring(plStack_18,2,(size_t *)&s);
  pos = luaL_optinteger(plStack_18,3,1);
  s2 = (char *)posrelat(pos,lp);
  if ((long)s2 < 1) {
    s2 = (char *)0x1;
  }
  else if ((long)(lp + 1) < (long)s2) {
    lua_pushnil(plStack_18);
    return 1;
  }
  if ((ls._4_4_ == 0) ||
     ((iVar2 = lua_toboolean(plStack_18,4), iVar2 == 0 &&
      (iVar2 = nospecials((char *)init,(size_t)s), iVar2 == 0)))) {
    cVar1 = *(char *)init;
    if (cVar1 == '^') {
      init = init + 1;
      s = s + -1;
    }
    prepstate((MatchState *)&s1,plStack_18,s_00,lp,(char *)init,(size_t)s);
    pcStack_280 = s_00 + (long)s2 + -1;
    do {
      reprepstate((MatchState *)&s1);
      e = match((MatchState *)&s1,pcStack_280,(char *)init);
      if (e != (char *)0x0) {
        if (ls._4_4_ != 0) {
          lua_pushinteger(plStack_18,(lua_Integer)(pcStack_280 + (1 - (long)s_00)));
          lua_pushinteger(plStack_18,(long)e - (long)s_00);
          iVar2 = push_captures((MatchState *)&s1,(char *)0x0,(char *)0x0);
          return iVar2 + 2;
        }
        iVar2 = push_captures((MatchState *)&s1,pcStack_280,e);
        return iVar2;
      }
      bVar3 = pcStack_280 < ms.src_init;
      pcStack_280 = pcStack_280 + 1;
    } while (bVar3 && cVar1 != '^');
  }
  else {
    ms.capture[0x1f].len =
         (ptrdiff_t)lmemfind(s_00 + (long)s2 + -1,(lp - (long)s2) + 1,(char *)init,(size_t)s);
    if ((char *)ms.capture[0x1f].len != (char *)0x0) {
      lua_pushinteger(plStack_18,(lua_Integer)(ms.capture[0x1f].len + (1 - (long)s_00)));
      lua_pushinteger(plStack_18,(lua_Integer)(s + (ms.capture[0x1f].len - (long)s_00)));
      return 2;
    }
    ms.capture[0x1f].len = 0;
  }
  lua_pushnil(plStack_18);
  return 1;
}

Assistant:

static int str_find_aux (lua_State *L, int find) {
  size_t ls, lp;
  const char *s = luaL_checklstring(L, 1, &ls);
  const char *p = luaL_checklstring(L, 2, &lp);
  size_t init = posrelatI(luaL_optinteger(L, 3, 1), ls) - 1;
  if (init > ls) {  /* start after string's end? */
    luaL_pushfail(L);  /* cannot find anything */
    return 1;
  }
  /* explicit request or no special characters? */
  if (find && (lua_toboolean(L, 4) || nospecials(p, lp))) {
    /* do a plain search */
    const char *s2 = lmemfind(s + init, ls - init, p, lp);
    if (s2) {
      lua_pushinteger(L, (s2 - s) + 1);
      lua_pushinteger(L, (s2 - s) + lp);
      return 2;
    }
  }
  else {
    MatchState ms;
    const char *s1 = s + init;
    int anchor = (*p == '^');
    if (anchor) {
      p++; lp--;  /* skip anchor character */
    }
    prepstate(&ms, L, s, ls, p, lp);
    do {
      const char *res;
      reprepstate(&ms);
      if ((res=match(&ms, s1, p)) != NULL) {
        if (find) {
          lua_pushinteger(L, (s1 - s) + 1);  /* start */
          lua_pushinteger(L, res - s);   /* end */
          return push_captures(&ms, NULL, 0) + 2;
        }
        else
          return push_captures(&ms, s1, res);
      }
    } while (s1++ < ms.src_end && !anchor);
  }
  luaL_pushfail(L);  /* not found */
  return 1;
}